

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

void __thiscall spv::Block::dump(Block *this,Vector<unsigned_int> *out)

{
  pointer puVar1;
  long lVar2;
  
  Instruction::dump((Instruction *)
                    (((this->instructions).
                      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                    _M_t,out);
  puVar1 = (this->localVariables).
           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->localVariables).
                              super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3)) {
    lVar2 = 0;
    do {
      Instruction::dump((Instruction *)
                        puVar1[lVar2]._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t,out);
      lVar2 = lVar2 + 1;
      puVar1 = (this->localVariables).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(this->localVariables).
                                         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)
                          >> 3));
  }
  puVar1 = (this->instructions).
           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (1 < (int)((ulong)((long)(this->instructions).
                              super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3)) {
    lVar2 = 1;
    do {
      Instruction::dump((Instruction *)
                        puVar1[lVar2]._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t,out);
      lVar2 = lVar2 + 1;
      puVar1 = (this->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(this->instructions).
                                         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)
                          >> 3));
  }
  return;
}

Assistant:

void dump(dxil_spv::Vector<unsigned int>& out) const
    {
        instructions[0]->dump(out);
        for (int i = 0; i < (int)localVariables.size(); ++i)
            localVariables[i]->dump(out);
        for (int i = 1; i < (int)instructions.size(); ++i)
            instructions[i]->dump(out);
    }